

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo2.cpp
# Opt level: O0

int64_t primesum::pi_lmo2(int64_t x)

{
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  long x_03;
  int256_t *this;
  int256_t *other;
  int256_t *extraout_RDX;
  long in_RDI;
  double y_00;
  int in_stack_0000001c;
  int64_t in_stack_00000020;
  int64_t in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  int256_t sum;
  int256_t phi;
  int256_t s2;
  int256_t s1;
  vector<int,_std::allocator<int>_> mu;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> primes;
  int256_t p2;
  int64_t c;
  int64_t y;
  int64_t x13;
  double alpha;
  int64_t in_stack_fffffffffffffe18;
  int256_t *in_stack_fffffffffffffe28;
  long in_stack_fffffffffffffe30;
  int256_t *this_00;
  undefined4 in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  int256_t *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  int256_t *in_stack_fffffffffffffe78;
  undefined8 in_stack_fffffffffffffe80;
  int64_t in_stack_fffffffffffffe88;
  int64_t in_stack_fffffffffffffe98;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffed8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee0;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffee8;
  int64_t in_stack_fffffffffffffef0;
  int threads;
  undefined8 in_stack_fffffffffffffff8;
  int64_t iVar1;
  
  if (in_RDI < 2) {
    iVar1 = 0;
  }
  else {
    threads = (int)(in_RDI >> 0x3f);
    x_01._8_8_ = in_stack_fffffffffffffe88;
    x_01._0_8_ = in_stack_fffffffffffffe80;
    y_00 = get_alpha_lmo((int128_t)x_01);
    iroot<3,long>(in_stack_fffffffffffffe30);
    PhiTiny::get_c(in_stack_fffffffffffffe18);
    x_02._8_8_ = in_stack_fffffffffffffff8;
    x_02._0_8_ = in_RDI;
    P2((int128_t)x_02,(int64_t)y_00,threads);
    generate_primes(CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    generate_lpf(in_stack_fffffffffffffe88);
    generate_moebius(in_stack_fffffffffffffe88);
    x_03 = in_RDI >> 0x3f;
    S1((int128_t)in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_0000001c);
    this = (int256_t *)
           anon_unknown.dwarf_a3ae0::S2
                     (x_03,in_RDI,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                      in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    int256_t::int256_t<long,void>((int256_t *)&stack0xfffffffffffffed8,(long)this);
    int256_t::operator+(this,in_stack_fffffffffffffe28);
    other = (int256_t *)prime_sum_tiny(in_stack_fffffffffffffe98);
    x_00._8_8_ = in_stack_fffffffffffffe68;
    x_00._0_8_ = in_stack_fffffffffffffe60;
    this_00 = extraout_RDX;
    int256_t::operator+(in_stack_fffffffffffffe78,(__int128)x_00);
    int256_t::operator-(in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c);
    int256_t::operator-(this,other);
    iVar1 = int256_t::operator_cast_to_long(this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
  }
  return iVar1;
}

Assistant:

int64_t pi_lmo2(int64_t x)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t c = PhiTiny::get_c(y);
  int256_t p2 = P2(x, y, 1);

  vector<int32_t> primes = generate_primes(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> mu = generate_moebius(y);

  int256_t s1 = S1(x, y, c, 1);
  int256_t s2 = S2(x, y, c, primes, lpf, mu);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return int64_t(sum);
}